

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lwlog-demo.c
# Opt level: O0

int main(void)

{
  FILE *pFVar1;
  int *piVar2;
  char *local_70;
  char *local_60;
  char *local_50;
  char *local_40;
  char *local_30;
  char *local_20;
  
  pFVar1 = _stderr;
  piVar2 = __errno_location();
  if (*piVar2 == 0) {
    local_20 = "None";
  }
  else {
    piVar2 = __errno_location();
    local_20 = strerror(*piVar2);
  }
  fprintf(pFVar1,
          "\x1b[0;31m[EMERG]   %s (%s:%d) \x1b[0mThis a emerge log.\x1b[1;33m errno: %s\n\x1b[0m",
          "main",
          "/workspace/llm4binary/github/license_all_cmakelists_25/gkthiruvathukal[P]systems-code-examples/lwlog-demo/lwlog-demo.c"
          ,0x13,local_20);
  pFVar1 = _stderr;
  piVar2 = __errno_location();
  if (*piVar2 == 0) {
    local_30 = "None";
  }
  else {
    piVar2 = __errno_location();
    local_30 = strerror(*piVar2);
  }
  fprintf(pFVar1,
          "\x1b[0;35m[ALERT]   %s (%s:%d) \x1b[0mThis a alert log.\x1b[1;33m errno: %s\n\x1b[0m",
          "main",
          "/workspace/llm4binary/github/license_all_cmakelists_25/gkthiruvathukal[P]systems-code-examples/lwlog-demo/lwlog-demo.c"
          ,0x14,local_30);
  pFVar1 = _stderr;
  piVar2 = __errno_location();
  if (*piVar2 == 0) {
    local_40 = "None";
  }
  else {
    piVar2 = __errno_location();
    local_40 = strerror(*piVar2);
  }
  fprintf(pFVar1,
          "\x1b[1;33m[CRIT]    %s (%s:%d) \x1b[0mThis a crit log.\x1b[1;33m errno: %s\n\x1b[0m",
          "main",
          "/workspace/llm4binary/github/license_all_cmakelists_25/gkthiruvathukal[P]systems-code-examples/lwlog-demo/lwlog-demo.c"
          ,0x15,local_40);
  pFVar1 = _stderr;
  piVar2 = __errno_location();
  if (*piVar2 == 0) {
    local_50 = "None";
  }
  else {
    piVar2 = __errno_location();
    local_50 = strerror(*piVar2);
  }
  fprintf(pFVar1,
          "\x1b[0;33m[ERR]     %s (%s:%d) \x1b[0mThis a err log.\x1b[1;33m errno: %s\n\x1b[0m",
          "main",
          "/workspace/llm4binary/github/license_all_cmakelists_25/gkthiruvathukal[P]systems-code-examples/lwlog-demo/lwlog-demo.c"
          ,0x16,local_50);
  pFVar1 = _stderr;
  piVar2 = __errno_location();
  if (*piVar2 == 0) {
    local_60 = "None";
  }
  else {
    piVar2 = __errno_location();
    local_60 = strerror(*piVar2);
  }
  fprintf(pFVar1,
          "\x1b[0;34m[WARNING] %s (%s:%d) \x1b[0mThis a warning log.\x1b[1;33m errno: %s\n\x1b[0m",
          "main",
          "/workspace/llm4binary/github/license_all_cmakelists_25/gkthiruvathukal[P]systems-code-examples/lwlog-demo/lwlog-demo.c"
          ,0x17,local_60);
  pFVar1 = _stderr;
  piVar2 = __errno_location();
  if (*piVar2 == 0) {
    local_70 = "None";
  }
  else {
    piVar2 = __errno_location();
    local_70 = strerror(*piVar2);
  }
  fprintf(pFVar1,
          "\x1b[0;36m[NOTICE]  %s (%s:%d) \x1b[0mThis a notice log.\x1b[1;33m errno: %s\n\x1b[0m",
          "main",
          "/workspace/llm4binary/github/license_all_cmakelists_25/gkthiruvathukal[P]systems-code-examples/lwlog-demo/lwlog-demo.c"
          ,0x18,local_70);
  fprintf(_stderr,"\x1b[0;32m[INFO]    %s (%s:%d) \x1b[0mThis a info log.\n","main",
          "/workspace/llm4binary/github/license_all_cmakelists_25/gkthiruvathukal[P]systems-code-examples/lwlog-demo/lwlog-demo.c"
          ,0x19);
  fprintf(_stderr,"\x1b[0;37m[DEBUG]   %s (%s:%d) \x1b[0mThis a debug log.\n","main",
          "/workspace/llm4binary/github/license_all_cmakelists_25/gkthiruvathukal[P]systems-code-examples/lwlog-demo/lwlog-demo.c"
          ,0x1a);
  return 0;
}

Assistant:

int main(void)
{
    lwlog_emerg("This a emerge log.");
    lwlog_alert("This a alert log.");
    lwlog_crit("This a crit log.");
    lwlog_err("This a err log.");
    lwlog_warning("This a warning log.");
    lwlog_notice("This a notice log.");
    lwlog_info("This a info log.");
    lwlog_debug("This a debug log.");

    return 0;
}